

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O3

int ddWindowConv3(DdManager *table,int low,int high)

{
  uint uVar1;
  undefined4 *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  void *__ptr;
  ulong uVar7;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  
  iVar9 = high - low;
  if (iVar9 < 2) {
    iVar9 = ddWindowConv2(table,low,high);
    return iVar9;
  }
  uVar1 = iVar9 - 1;
  __ptr = malloc((ulong)uVar1 * 4);
  auVar4 = _DAT_007ee2e0;
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_007a54ea:
    iVar9 = 0;
  }
  else {
    lVar8 = (ulong)uVar1 - 1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_007ee2e0;
    auVar11 = _DAT_007ee2c0;
    auVar12 = _DAT_007ee2d0;
    do {
      auVar13 = auVar12 ^ auVar4;
      iVar6 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar6 && auVar10._0_4_ < auVar13._0_4_ || iVar6 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)((long)__ptr + uVar7 * 4) = 1;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 4) = 1;
      }
      auVar13 = auVar11 ^ auVar4;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar6 && (iVar14 != iVar6 || auVar13._0_4_ <= auVar10._0_4_)) {
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 8) = 1;
        *(undefined4 *)((long)__ptr + uVar7 * 4 + 0xc) = 1;
      }
      uVar7 = uVar7 + 4;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar8 + 4;
      lVar8 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar8 + 4;
    } while ((iVar9 + 2U & 0xfffffffc) != uVar7);
    uVar7 = 0;
    bVar5 = false;
    do {
      do {
        bVar3 = bVar5;
        if (*(int *)((long)__ptr + uVar7 * 4) != 0) {
          iVar6 = ddPermuteWindow3(table,(int)uVar7 + low);
          if (5 < iVar6 - 1U) {
            free(__ptr);
            goto LAB_007a54ea;
          }
          puVar2 = (undefined4 *)((long)__ptr + uVar7 * 4);
          switch(iVar6) {
          case 1:
            break;
          case 2:
            if ((long)uVar7 < (long)(iVar9 + -2)) {
              puVar2[1] = 1;
            }
            bVar3 = true;
            lVar8 = -8;
            if (1 < uVar7) {
LAB_007a5494:
              *(undefined4 *)((long)puVar2 + lVar8) = 1;
              goto LAB_007a549b;
            }
            break;
          default:
            if ((long)uVar7 < (long)(iVar9 + -3)) {
              puVar2[2] = 1;
            }
            if ((long)uVar7 < (long)(iVar9 + -2)) {
              puVar2[1] = 1;
            }
            bVar3 = true;
            if (uVar7 != 0) {
              puVar2[-1] = 1;
              lVar8 = -8;
              if (uVar7 != 1) goto LAB_007a5494;
            }
            break;
          case 6:
            if ((long)uVar7 < (long)(iVar9 + -3)) {
              puVar2[2] = 1;
            }
            lVar8 = -4;
            if (uVar7 != 0) goto LAB_007a5494;
LAB_007a549b:
            bVar3 = true;
          }
          *puVar2 = 0;
        }
        uVar7 = uVar7 + 1;
        bVar5 = bVar3;
      } while (uVar7 != uVar1);
      uVar7 = 0;
      bVar5 = false;
    } while (bVar3);
    free(__ptr);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

static int
ddWindowConv3(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 2) return(ddWindowConv2(table,low,high));

    nwin = high-low-1;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                res = ddPermuteWindow3(table,x+low);
                switch (res) {
                case ABC:
                    break;
                case BAC:
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case BCA:
                case CBA:
                case CAB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    if (x > 1)          events[x-2] = 1;
                    newevent = 1;
                    break;
                case ACB:
                    if (x < nwin-2)     events[x+2] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                    break;
                default:
                    ABC_FREE(events);
                    return(0);
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res == ABC) {
                    (void) fprintf(table->out,"=");
                } else {
                    (void) fprintf(table->out,"-");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}